

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O0

bool __thiscall ON_wString::TruncateMid(ON_wString *this,int pos)

{
  ON_wStringHeader *pOVar1;
  int iVar2;
  size_t newLength;
  int length;
  int pos_local;
  ON_wString *this_local;
  
  if (pos < 1) {
    this_local._7_1_ = false;
  }
  else {
    pOVar1 = Header(this);
    iVar2 = pOVar1->string_length;
    if (iVar2 < pos) {
      this_local._7_1_ = false;
    }
    else {
      pOVar1 = Header(this);
      if (pOVar1 == pEmptyStringHeader) {
        this_local._7_1_ = false;
      }
      else {
        CopyArray(this);
        iVar2 = iVar2 - pos;
        memmove(this->m_s,this->m_s + pos,((long)iVar2 + 1) * 4);
        pOVar1 = Header(this);
        pOVar1->string_length = iVar2;
        this_local._7_1_ = true;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_wString::TruncateMid(int pos)
{
  if (pos <= 0)
    return false;

  const auto length = Header()->string_length;
  if (pos > length)
    return false;

  if (Header() == pEmptyStringHeader)
    return false; // Should never happen.

  CopyArray();
  const auto newLength = size_t(length - pos);
  memmove(m_s, m_s + pos, (newLength + 1) * sizeof(wchar_t));
  Header()->string_length = int(newLength);

  return true;
}